

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O1

void Rml::PluginRegistry::UnregisterPlugin(Plugin *plugin)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  __normal_iterator<Rml::Plugin_**,_std::vector<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>_>
  _Var5;
  Plugin *local_20;
  
  uVar4 = (*plugin->_vptr_Plugin[2])();
  if ((uVar4 & 1) != 0) {
    if (plugin_vectors._8_8_ == 0) {
      bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46);
      if (!bVar3) goto LAB_0024ce1d;
    }
    uVar2 = plugin_vectors._8_8_;
    local_20 = plugin;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<Rml::Plugin**,std::vector<Rml::Plugin*,std::allocator<Rml::Plugin*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::Plugin*const>>
                      (*(Plugin ***)plugin_vectors._8_8_,*(Plugin ***)(plugin_vectors._8_8_ + 8),
                       &local_20);
    if (_Var5._M_current != *(Plugin ***)(uVar2 + 8)) {
      *(Plugin ***)(uVar2 + 8) = _Var5._M_current;
    }
  }
  if ((uVar4 & 2) != 0) {
    if (plugin_vectors._8_8_ == 0) {
      bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46);
      if (!bVar3) goto LAB_0024ce1d;
    }
    uVar2 = plugin_vectors._8_8_;
    local_20 = plugin;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<Rml::Plugin**,std::vector<Rml::Plugin*,std::allocator<Rml::Plugin*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::Plugin*const>>
                      (*(Plugin ***)(plugin_vectors._8_8_ + 0x18),
                       *(Plugin ***)(plugin_vectors._8_8_ + 0x20),&local_20);
    if (_Var5._M_current != *(Plugin ***)(uVar2 + 0x20)) {
      *(Plugin ***)(uVar2 + 0x20) = _Var5._M_current;
    }
  }
  if ((uVar4 & 4) != 0) {
    if (plugin_vectors._8_8_ == 0) {
      bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46);
      if (!bVar3) {
LAB_0024ce1d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    uVar2 = plugin_vectors._8_8_;
    local_20 = plugin;
    _Var5 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<Rml::Plugin**,std::vector<Rml::Plugin*,std::allocator<Rml::Plugin*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::Plugin*const>>
                      (*(Plugin ***)(plugin_vectors._8_8_ + 0x30),
                       *(Plugin ***)(plugin_vectors._8_8_ + 0x38),&local_20);
    if (_Var5._M_current != *(Plugin ***)(uVar2 + 0x38)) {
      *(Plugin ***)(uVar2 + 0x38) = _Var5._M_current;
    }
  }
  return;
}

Assistant:

void PluginRegistry::UnregisterPlugin(Plugin* plugin)
{
	auto erase_value = [](Vector<Plugin*>& container, Plugin* value) {
		container.erase(std::remove(container.begin(), container.end(), value), container.end());
	};

	int event_classes = plugin->GetEventClasses();
	if (event_classes & Plugin::EVT_BASIC)
		erase_value(plugin_vectors->basic, plugin);
	if (event_classes & Plugin::EVT_DOCUMENT)
		erase_value(plugin_vectors->document, plugin);
	if (event_classes & Plugin::EVT_ELEMENT)
		erase_value(plugin_vectors->element, plugin);
}